

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase.cpp
# Opt level: O1

optional<CService> *
Lookup(optional<CService> *__return_storage_ptr__,string *name,uint16_t portDefault,
      bool fAllowLookup,DNSLookupFn dns_lookup_function)

{
  DNSLookupFn dns_lookup_function_00;
  function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  *in_R8;
  long in_FS_OFFSET;
  _Any_data in_stack_ffffffffffffff98;
  _Manager_type in_stack_ffffffffffffffa8;
  _Invoker_type in_stack_ffffffffffffffb0;
  vector<CService,_std::allocator<CService>_> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  ::function((function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
              *)&stack0xffffffffffffff98,in_R8);
  dns_lookup_function_00.super__Function_base._M_manager = in_stack_ffffffffffffffa8;
  dns_lookup_function_00.super__Function_base._M_functor = in_stack_ffffffffffffff98;
  dns_lookup_function_00._M_invoker = in_stack_ffffffffffffffb0;
  Lookup(&local_48,name,portDefault,fAllowLookup,1,dns_lookup_function_00);
  if (in_stack_ffffffffffffffa8 != (_Manager_type)0x0) {
    (*in_stack_ffffffffffffffa8)
              ((_Any_data *)&stack0xffffffffffffff98,(_Any_data *)&stack0xffffffffffffff98,
               __destroy_functor);
  }
  if (local_48.super__Vector_base<CService,_std::allocator<CService>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_48.super__Vector_base<CService,_std::allocator<CService>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)__return_storage_ptr__,
               (prevector<16U,_unsigned_char,_unsigned_int,_int> *)
               local_48.super__Vector_base<CService,_std::allocator<CService>_>._M_impl.
               super__Vector_impl_data._M_start);
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<CService,_false,_false>)._M_payload.
             super__Optional_payload<CService,_true,_false,_false>.
             super__Optional_payload_base<CService>._M_payload + 0x18) =
         *(undefined8 *)
          ((long)&(local_48.super__Vector_base<CService,_std::allocator<CService>_>._M_impl.
                   super__Vector_impl_data._M_start)->super_CNetAddr + 0x18);
    (__return_storage_ptr__->super__Optional_base<CService,_false,_false>)._M_payload.
    super__Optional_payload<CService,_true,_false,_false>.super__Optional_payload_base<CService>.
    _M_payload._M_value.port =
         (local_48.super__Vector_base<CService,_std::allocator<CService>_>._M_impl.
          super__Vector_impl_data._M_start)->port;
  }
  (__return_storage_ptr__->super__Optional_base<CService,_false,_false>)._M_payload.
  super__Optional_payload<CService,_true,_false,_false>.super__Optional_payload_base<CService>.
  _M_engaged = local_48.super__Vector_base<CService,_std::allocator<CService>_>._M_impl.
               super__Vector_impl_data._M_start !=
               local_48.super__Vector_base<CService,_std::allocator<CService>_>._M_impl.
               super__Vector_impl_data._M_finish;
  std::vector<CService,_std::allocator<CService>_>::~vector(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<CService> Lookup(const std::string& name, uint16_t portDefault, bool fAllowLookup, DNSLookupFn dns_lookup_function)
{
    const std::vector<CService> services{Lookup(name, portDefault, fAllowLookup, 1, dns_lookup_function)};

    return services.empty() ? std::nullopt : std::make_optional(services.front());
}